

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O1

idx_t __thiscall
duckdb::JoinHashTable::GetTotalSize
          (JoinHashTable *this,vector<unsigned_long,_true> *partition_sizes,
          vector<unsigned_long,_true> *partition_counts,idx_t *max_partition_size,
          idx_t *max_partition_count)

{
  size_type __n;
  value_type vVar1;
  const_reference pvVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  idx_t iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  ulong local_60;
  
  iVar6 = this->radix_bits;
  *max_partition_size = 0;
  local_60 = 0;
  *max_partition_count = 0;
  uVar7 = 1;
  lVar9 = 0;
  lVar8 = 0;
  do {
    __n = uVar7 - 1;
    pvVar2 = vector<unsigned_long,_true>::operator[](partition_sizes,__n);
    lVar8 = lVar8 + *pvVar2;
    pvVar2 = vector<unsigned_long,_true>::operator[](partition_counts,__n);
    lVar9 = lVar9 + *pvVar2;
    pvVar2 = vector<unsigned_long,_true>::operator[](partition_sizes,__n);
    vVar1 = *pvVar2;
    pvVar2 = vector<unsigned_long,_true>::operator[](partition_counts,__n);
    auVar10._0_8_ = (double)CONCAT44(0x43300000,(int)*pvVar2);
    auVar10._8_4_ = (int)(*pvVar2 >> 0x20);
    auVar10._12_4_ = 0x45300000;
    dVar12 = ((auVar10._8_8_ - 1.9342813113834067e+25) + (auVar10._0_8_ - 4503599627370496.0)) *
             this->load_factor;
    uVar3 = (ulong)dVar12;
    uVar4 = NextPowerOfTwo((long)(dVar12 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3);
    if (uVar4 < 0x4001) {
      uVar4 = 0x4000;
    }
    uVar3 = vVar1 + uVar4 * 8;
    if (local_60 < uVar3) {
      pvVar2 = vector<unsigned_long,_true>::operator[](partition_sizes,__n);
      *max_partition_size = *pvVar2;
      pvVar2 = vector<unsigned_long,_true>::operator[](partition_counts,__n);
      *max_partition_count = *pvVar2;
      local_60 = uVar3;
    }
    uVar3 = uVar7 >> ((byte)iVar6 & 0x3f);
    uVar7 = uVar7 + 1;
  } while (uVar3 == 0);
  if (lVar9 == 0) {
    iVar6 = 0;
  }
  else {
    auVar11._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar11._0_8_ = lVar9;
    auVar11._12_4_ = 0x45300000;
    dVar12 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) * this->load_factor;
    uVar7 = (ulong)dVar12;
    uVar5 = NextPowerOfTwo((long)(dVar12 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7);
    uVar4 = 0x4000;
    if (0x4000 < uVar5) {
      uVar4 = uVar5;
    }
    iVar6 = uVar4 * 8 + lVar8;
  }
  return iVar6;
}

Assistant:

idx_t JoinHashTable::GetTotalSize(const vector<idx_t> &partition_sizes, const vector<idx_t> &partition_counts,
                                  idx_t &max_partition_size, idx_t &max_partition_count) const {
	const auto num_partitions = RadixPartitioning::NumberOfPartitions(radix_bits);

	idx_t total_size = 0;
	idx_t total_count = 0;
	idx_t max_partition_ht_size = 0;
	max_partition_size = 0;
	max_partition_count = 0;
	for (idx_t i = 0; i < num_partitions; i++) {
		total_size += partition_sizes[i];
		total_count += partition_counts[i];

		auto partition_size = partition_sizes[i] + PointerTableSize(partition_counts[i]);
		if (partition_size > max_partition_ht_size) {
			max_partition_ht_size = partition_size;
			max_partition_size = partition_sizes[i];
			max_partition_count = partition_counts[i];
		}
	}

	if (total_count == 0) {
		return 0;
	}

	return total_size + PointerTableSize(total_count);
}